

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O1

unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
__thiscall
duckdb::Binder::BindLimitPercent
          (Binder *this,OrderBinder *order_binder,LimitPercentModifier *limit_mod)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar2;
  element_type *this_00;
  pointer pBVar3;
  long in_RCX;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::BoundLimitModifier_*,_false> local_60;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_58;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_50;
  BoundLimitNode local_48;
  
  this_00 = (element_type *)operator_new(0x50);
  BoundLimitModifier::BoundLimitModifier((BoundLimitModifier *)this_00);
  local_60._M_head_impl = (BoundLimitModifier *)this_00;
  if (*(long *)(in_RCX + 0x10) != 0) {
    local_50._M_head_impl = *(ParsedExpression **)(in_RCX + 0x10);
    *(undefined8 *)(in_RCX + 0x10) = 0;
    BindLimitValue(&local_48,(Binder *)order_binder,(OrderBinder *)limit_mod,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_50,true,false);
    pBVar3 = unique_ptr<duckdb::BoundLimitModifier,_std::default_delete<duckdb::BoundLimitModifier>,_true>
             ::operator->((unique_ptr<duckdb::BoundLimitModifier,_std::default_delete<duckdb::BoundLimitModifier>,_true>
                           *)&local_60);
    uVar2.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         local_48.expression.
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar3->limit_val).constant_percentage = local_48.constant_percentage;
    (pBVar3->limit_val).type = local_48.type;
    *(undefined3 *)&(pBVar3->limit_val).field_0x1 = local_48._1_3_;
    *(undefined4 *)&(pBVar3->limit_val).field_0x4 = local_48._4_4_;
    *(undefined4 *)&(pBVar3->limit_val).constant_integer = (undefined4)local_48.constant_integer;
    *(undefined4 *)((long)&(pBVar3->limit_val).constant_integer + 4) =
         local_48.constant_integer._4_4_;
    local_48.expression.
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    _Var1._M_head_impl =
         (pBVar3->limit_val).expression.
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar3->limit_val).expression.
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (Expression *)
         uVar2.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_48.expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)local_48.expression.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
    local_48.expression.
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    if (local_50._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_50._M_head_impl = (ParsedExpression *)0x0;
  }
  if (*(long *)(in_RCX + 0x18) != 0) {
    local_58._M_head_impl = *(ParsedExpression **)(in_RCX + 0x18);
    *(undefined8 *)(in_RCX + 0x18) = 0;
    BindLimitValue(&local_48,(Binder *)order_binder,(OrderBinder *)limit_mod,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_58,false,true);
    pBVar3 = unique_ptr<duckdb::BoundLimitModifier,_std::default_delete<duckdb::BoundLimitModifier>,_true>
             ::operator->((unique_ptr<duckdb::BoundLimitModifier,_std::default_delete<duckdb::BoundLimitModifier>,_true>
                           *)&local_60);
    uVar2.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         local_48.expression;
    (pBVar3->offset_val).constant_percentage = local_48.constant_percentage;
    (pBVar3->offset_val).type = local_48.type;
    *(undefined3 *)&(pBVar3->offset_val).field_0x1 = local_48._1_3_;
    *(undefined4 *)&(pBVar3->offset_val).field_0x4 = local_48._4_4_;
    *(undefined4 *)&(pBVar3->offset_val).constant_integer = (undefined4)local_48.constant_integer;
    *(undefined4 *)((long)&(pBVar3->offset_val).constant_integer + 4) =
         local_48.constant_integer._4_4_;
    local_48.expression.
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    _Var1._M_head_impl =
         (pBVar3->offset_val).expression.
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar3->offset_val).expression.
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (Expression *)
         uVar2.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_48.expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)local_48.expression.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
    local_48.expression.
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    if (local_58._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_60._M_head_impl;
  return (unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>_>
         )(unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>_>
           )this;
}

Assistant:

unique_ptr<BoundResultModifier> Binder::BindLimitPercent(OrderBinder &order_binder, LimitPercentModifier &limit_mod) {
	auto result = make_uniq<BoundLimitModifier>();
	if (limit_mod.limit) {
		result->limit_val = BindLimitValue(order_binder, std::move(limit_mod.limit), true, false);
	}
	if (limit_mod.offset) {
		result->offset_val = BindLimitValue(order_binder, std::move(limit_mod.offset), false, true);
	}
	return std::move(result);
}